

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::clear
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,Node **x)

{
  Node *pNVar1;
  
  pNVar1 = this->nil;
  if (*x != pNVar1) {
    if ((*x)->parent == pNVar1) {
      this->nodebegin = pNVar1;
    }
    clear(this,&(*x)->left);
    clear(this,&(*x)->right);
    pNVar1 = *x;
    if (pNVar1 != (Node *)0x0) {
      if (pNVar1->value != (value_type *)0x0) {
        operator_delete(pNVar1->value,0x10);
      }
      operator_delete(pNVar1,0x28);
    }
    *x = this->nil;
    this->tot = this->tot - 1;
  }
  return;
}

Assistant:

void clear(Node *&x)
	{
		if (x == nil) return;
		if (x -> parent == nil) nodebegin = nil;
		clear(x -> left) , clear(x -> right) , delete x , x = nil , -- tot;
	}